

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix4d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  StreamReader *pSVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  _Alloc_hider _Var9;
  iterator iVar10;
  byte bVar11;
  char c;
  matrix4d value;
  string local_d0;
  undefined1 local_b0 [32];
  double dStack_90;
  double local_88;
  double local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar11 = 0;
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (!bVar4) {
    return false;
  }
  local_b0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x3ff0000000000000;
  local_b0._8_8_ = 0.0;
  local_b0._16_8_ = 0.0;
  local_b0._24_8_ = 0.0;
  dStack_90 = 0.0;
  local_88 = 1.0;
  local_80 = 0.0;
  dStack_78 = 0.0;
  local_70 = 0.0;
  dStack_68 = 0.0;
  local_60 = 1.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_38 = 1.0;
  bVar4 = ParseMatrix(this,(matrix4d *)local_b0);
  if (bVar4) {
    iVar10._M_current =
         (result->
         super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (result->
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>::
      _M_realloc_insert<tinyusdz::value::matrix4d_const&>
                ((vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>> *)
                 result,iVar10,(matrix4d *)local_b0);
    }
    else {
      pdVar8 = (double *)local_b0;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (iVar10._M_current)->m[0][0] = *pdVar8;
        pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
        iVar10._M_current = (matrix4d *)((long)iVar10._M_current + ((ulong)bVar11 * -2 + 1) * 8);
      }
      ppmVar1 = &(result->
                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppmVar1 = *ppmVar1 + 1;
    }
    do {
      pSVar3 = this->_sr;
      if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
      goto LAB_003b8422;
      bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar4) {
        return false;
      }
      bVar4 = Char1(this,(char *)&local_d0);
      if (!bVar4) {
        return false;
      }
      if ((char)local_d0._M_dataplus._M_p == sep) {
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = LookChar1(this,local_b0);
        if (!bVar4) {
          return false;
        }
        iVar5 = 3;
        if (local_b0[0] != end_symbol) {
          goto LAB_003b835a;
        }
      }
      else {
LAB_003b835a:
        if ((char)local_d0._M_dataplus._M_p != sep) {
          pSVar3 = this->_sr;
          if ((0 < (long)pSVar3->idx_) && (uVar7 = pSVar3->idx_ - 1, uVar7 <= pSVar3->length_)) {
            pSVar3->idx_ = uVar7;
          }
          goto LAB_003b8422;
        }
        bVar4 = SkipWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        local_b0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        local_b0._24_8_ = 0.0;
        dStack_90 = 0.0;
        local_b0._8_8_ = 0.0;
        local_b0._16_8_ = 0.0;
        local_88 = 1.0;
        local_70 = 0.0;
        dStack_68 = 0.0;
        local_80 = 0.0;
        dStack_78 = 0.0;
        local_60 = 1.0;
        local_48 = 0.0;
        dStack_40 = 0.0;
        local_58 = 0.0;
        dStack_50 = 0.0;
        local_38 = 1.0;
        bVar4 = ParseMatrix(this,(matrix4d *)local_b0);
        iVar5 = 3;
        if (bVar4) {
          iVar10._M_current =
               (result->
               super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (result->
              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>::
            _M_realloc_insert<tinyusdz::value::matrix4d_const&>
                      ((vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>
                        *)result,iVar10,(matrix4d *)local_b0);
          }
          else {
            pdVar8 = (double *)local_b0;
            for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
              (iVar10._M_current)->m[0][0] = *pdVar8;
              pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
              iVar10._M_current =
                   (matrix4d *)((long)iVar10._M_current + ((ulong)bVar11 * -2 + 1) * 8);
            }
            ppmVar1 = &(result->
                       super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          iVar5 = 0;
        }
      }
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      return false;
    }
LAB_003b8422:
    if ((result->
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
        _M_impl.super__Vector_impl_data._M_start !=
        (result->
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    local_b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_b0 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Empty array.\n","");
    PushError(this,(string *)local_b0);
    local_d0.field_2._M_allocated_capacity = local_b0._16_8_;
    _Var9._M_p = (pointer)local_b0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b0 + 0x10)) {
      return false;
    }
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Not starting with the value of requested type.\n","");
    PushError(this,&local_d0);
    _Var9._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return false;
    }
  }
  operator_delete(_Var9._M_p,local_d0.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}